

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

FoldingSetNodeIDRef __thiscall
llvm::FoldingSetNodeID::Intern(FoldingSetNodeID *this,BumpPtrAllocator *Allocator)

{
  uint *__first;
  void *pvVar1;
  size_t sVar2;
  uint *__result;
  uint *New;
  BumpPtrAllocator *Allocator_local;
  FoldingSetNodeID *this_local;
  FoldingSetNodeID *local_20;
  FoldingSetNodeID *local_18;
  FoldingSetNodeID *local_10;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  __result = AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::
             Allocate<unsigned_int>
                       ((AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                         *)Allocator,sVar2);
  __first = (uint *)(this->Bits).super_SmallVectorImpl<unsigned_int>.
                    super_SmallVectorTemplateBase<unsigned_int,_true>.
                    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX
  ;
  pvVar1 = (this->Bits).super_SmallVectorImpl<unsigned_int>.
           super_SmallVectorTemplateBase<unsigned_int,_true>.
           super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  local_20 = this;
  local_18 = this;
  local_10 = this;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  std::uninitialized_copy<unsigned_int_const*,unsigned_int*>
            (__first,(uint *)((long)pvVar1 + sVar2 * 4),__result);
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  FoldingSetNodeIDRef::FoldingSetNodeIDRef((FoldingSetNodeIDRef *)&this_local,__result,sVar2);
  return _this_local;
}

Assistant:

FoldingSetNodeIDRef
FoldingSetNodeID::Intern(BumpPtrAllocator &Allocator) const {
  unsigned *New = Allocator.Allocate<unsigned>(Bits.size());
  std::uninitialized_copy(Bits.begin(), Bits.end(), New);
  return FoldingSetNodeIDRef(New, Bits.size());
}